

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_common.c
# Opt level: O1

void make_glx_context_current_or_skip(Display *dpy)

{
  bool bVar1;
  int iVar2;
  XVisualInfo *visinfo;
  Window WVar3;
  long lVar4;
  long lVar5;
  Display *pDVar6;
  int iStack_5c;
  int iStack_4c;
  Display *pDStack_48;
  
  visinfo = get_glx_visual(dpy);
  WVar3 = get_glx_window(dpy,visinfo,false);
  pDVar6 = dpy;
  lVar4 = (*_epoxy_glXCreateContext)(dpy,visinfo,0,1);
  if (lVar4 == 0) {
    make_glx_context_current_or_skip_cold_1();
    pDStack_48 = dpy;
    lVar4 = (*_epoxy_glXGetFBConfigs)();
    if (lVar4 != 0) {
      if (0 < iStack_5c) {
        lVar5 = 0;
        do {
          iVar2 = (*_epoxy_glXGetFBConfigAttrib)
                            (pDVar6,*(undefined8 *)(lVar4 + lVar5 * 8),0x800b,&iStack_4c);
          if ((iVar2 == 0) && (iStack_4c == (int)visinfo->visualid)) {
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        } while ((!bVar1) && (lVar5 = lVar5 + 1, lVar5 < iStack_5c));
      }
      XFree(lVar4);
    }
    return;
  }
  (*_epoxy_glXMakeCurrent)(dpy,WVar3,lVar4,_epoxy_glXMakeCurrent);
  return;
}

Assistant:

void
make_glx_context_current_or_skip(Display *dpy)
{
	GLXContext ctx;
	XVisualInfo *visinfo = get_glx_visual(dpy);
	Window win = get_glx_window(dpy, visinfo, false);

	ctx = glXCreateContext(dpy, visinfo, False, True);
	if (ctx == None) {
		fprintf(stderr, "glXCreateContext failed\n");
		exit(1);
	}

	glXMakeCurrent(dpy, win, ctx);
}